

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void initMemory(vm *v)

{
  module *pmVar1;
  data_pointer paVar2;
  memory *m;
  byte *pbVar3;
  uint64 offset_00;
  uint64 offset;
  data_pointer d;
  int i;
  module *module;
  memory *memory;
  vm *v_local;
  
  if ((v->m->mem_sec).mem_segment_count != 0) {
    m = &v->memory;
    pmVar1 = v->m;
    m->limit = (pmVar1->mem_sec).mem_segment_addr;
    (v->memory).pageCount = (ulong)m->limit->min;
    pbVar3 = (byte *)malloc((v->memory).pageCount << 0x10);
    (v->memory).data = pbVar3;
    for (d._4_4_ = 0; d._4_4_ < (pmVar1->data_sec).data_segment_count; d._4_4_ = d._4_4_ + 1) {
      paVar2 = (pmVar1->data_sec).data_segment_addr;
      execInst(v,&paVar2[(int)d._4_4_].offset);
      offset_00 = popU64(&v->operandStack);
      write_memory(m,offset_00,paVar2[(int)d._4_4_].init_data,paVar2[(int)d._4_4_].init_data_count);
    }
  }
  return;
}

Assistant:

void initMemory(vm *v) {
    if (v->m->mem_sec.mem_segment_count > 0) {
        memory *memory = &v->memory;
        module *module = v->m;
        memory->limit = module->mem_sec.mem_segment_addr;
        memory->pageCount = memory->limit->min;
        memory->data = malloc(memory->pageCount * PAGE_SIZE);
        /*写入数据段的内容*/
        for (int i = 0; i < module->data_sec.data_segment_count; ++i) {
            data_pointer d = module->data_sec.data_segment_addr + i;
            execInst(v, &d->offset);
            uint64 offset = popU64(&v->operandStack);
            write_memory(memory, offset, d->init_data, d->init_data_count);
        }
    }
}